

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

uint8 * load_jpeg_image(jpeg *z,int *out_x,int *out_y,int *comp,int req_comp)

{
  anon_struct_72_14_dbcb52e3 *paVar1;
  uint8 uVar2;
  int iVar3;
  uint32 uVar4;
  uint uVar5;
  undefined8 uVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  void *pvVar14;
  code *pcVar15;
  uint8 *puVar16;
  uint uVar17;
  code *pcVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  anon_struct_72_14_dbcb52e3 *paVar22;
  uint8 *puVar23;
  int iVar24;
  int *piVar25;
  long lVar26;
  int *piVar27;
  uint8 *coutput [4];
  short data [64];
  int local_180;
  void *local_118;
  long local_110;
  long local_108;
  short local_f8 [20];
  int local_d0 [40];
  
  if (4 < (uint)req_comp) {
    failure_reason = "Internal error";
    return (uint8 *)0x0;
  }
  (z->s).img_n = 0;
  z->restart_interval = 0;
  iVar8 = decode_jpeg_header(z,0);
  if (iVar8 != 0) {
    bVar7 = get_marker(z);
    paVar1 = z->img_comp;
    while (bVar7 != 0xda) {
      if (bVar7 == 0xd9) {
        uVar10 = (z->s).img_n;
        if (req_comp == 0) {
          req_comp = uVar10;
        }
        uVar17 = 1;
        if (2 < req_comp) {
          uVar17 = uVar10;
        }
        if (uVar10 != 3) {
          uVar17 = uVar10;
        }
        uVar10 = (z->s).img_x;
        if ((int)uVar17 < 1) goto LAB_00155992;
        piVar25 = local_d0;
        lVar26 = 0;
        goto LAB_001558b7;
      }
      local_180 = process_marker(z,(uint)bVar7);
LAB_00155330:
      if (local_180 == 0) goto LAB_00155840;
LAB_00155338:
      bVar7 = get_marker(z);
    }
    iVar8 = get8(&z->s);
    iVar12 = get8(&z->s);
    iVar9 = get8(&z->s);
    z->scan_n = iVar9;
    if (((0xfffffffb < iVar9 - 5U) && (iVar9 <= (z->s).img_n)) &&
       (iVar8 * 0x100 + iVar12 == iVar9 * 2 + 6)) {
      lVar26 = 0;
      do {
        iVar12 = get8(&z->s);
        uVar10 = get8(&z->s);
        iVar8 = (z->s).img_n;
        if ((long)iVar8 < 1) {
          uVar21 = 0;
        }
        else {
          uVar21 = 0;
          paVar22 = paVar1;
          while (paVar22->id != iVar12) {
            uVar21 = uVar21 + 1;
            paVar22 = paVar22 + 1;
            if ((long)iVar8 == uVar21) goto LAB_00155840;
          }
        }
        if ((int)uVar21 == iVar8) goto LAB_00155840;
        z->img_comp[uVar21 & 0xffffffff].hd = (int)uVar10 >> 4;
        if ((3 < (int)uVar10 >> 4) ||
           (paVar1[uVar21 & 0xffffffff].ha = uVar10 & 0xf, 3 < (uVar10 & 0xf))) goto LAB_00155832;
        z->order[lVar26] = (int)uVar21;
        lVar26 = lVar26 + 1;
      } while (lVar26 < z->scan_n);
      iVar8 = get8(&z->s);
      if (iVar8 == 0) {
        get8(&z->s);
        iVar8 = get8(&z->s);
        if (iVar8 == 0) {
          z->code_buffer = 0;
          z->code_bits = 0;
          z->nomore = 0;
          z->img_comp[2].dc_pred = 0;
          z->img_comp[1].dc_pred = 0;
          z->img_comp[0].dc_pred = 0;
          z->marker = 0xff;
          iVar8 = z->restart_interval;
          if (iVar8 == 0) {
            iVar8 = 0x7fffffff;
          }
          z->todo = iVar8;
          if (z->scan_n == 1) {
            iVar8 = z->order[0];
            iVar12 = z->img_comp[iVar8].y + 7 >> 3;
            if (0 < iVar12) {
              uVar10 = paVar1[iVar8].x + 7 >> 3;
              iVar9 = 0;
              iVar13 = 0;
              do {
                if (0 < (int)uVar10) {
                  lVar26 = 0;
                  do {
                    iVar20 = decode_block(z,local_f8,z->huff_dc + paVar1[iVar8].hd,
                                          z->huff_ac + paVar1[iVar8].ha,iVar8);
                    if (iVar20 == 0) {
                      local_180 = 0;
                      goto LAB_00155330;
                    }
                    idct_block(paVar1[iVar8].data + lVar26 + iVar9 * paVar1[iVar8].w2,
                               paVar1[iVar8].w2,local_f8,z->dequant[paVar1[iVar8].tq]);
                    iVar20 = z->todo;
                    z->todo = iVar20 + -1;
                    if (iVar20 < 2) {
                      if (z->code_bits < 0x18) {
                        grow_buffer_unsafe(z);
                      }
                      if ((z->marker & 0xf8) != 0xd0) {
                        local_180 = 1;
                        goto LAB_00155330;
                      }
                      z->code_buffer = 0;
                      z->code_bits = 0;
                      z->nomore = 0;
                      z->img_comp[2].dc_pred = 0;
                      z->img_comp[1].dc_pred = 0;
                      z->img_comp[0].dc_pred = 0;
                      z->marker = 0xff;
                      iVar20 = z->restart_interval;
                      if (iVar20 == 0) {
                        iVar20 = 0x7fffffff;
                      }
                      z->todo = iVar20;
                    }
                    lVar26 = lVar26 + 8;
                  } while ((ulong)uVar10 * 8 != lVar26);
                }
                iVar13 = iVar13 + 1;
                iVar9 = iVar9 + 8;
              } while (iVar13 != iVar12);
            }
          }
          else {
            iVar12 = z->img_mcu_y;
            if (0 < iVar12) {
              iVar9 = z->img_mcu_x;
              iVar13 = 0;
              do {
                if (0 < iVar9) {
                  iVar20 = 0;
                  iVar12 = iVar8;
                  do {
                    iVar8 = z->scan_n;
                    if (0 < iVar8) {
                      lVar26 = 0;
                      do {
                        iVar12 = z->order[lVar26];
                        iVar9 = z->img_comp[iVar12].v;
                        if (0 < iVar9) {
                          iVar8 = paVar1[iVar12].h;
                          iVar24 = 0;
                          do {
                            if (0 < iVar8) {
                              local_180 = 0;
                              iVar9 = 0;
                              do {
                                iVar3 = paVar1[iVar12].v;
                                iVar11 = decode_block(z,local_f8,z->huff_dc + paVar1[iVar12].hd,
                                                      z->huff_ac + paVar1[iVar12].ha,iVar12);
                                if (iVar11 == 0) goto LAB_00155330;
                                idct_block(paVar1[iVar12].data +
                                           (long)((iVar8 * iVar20 + iVar9) * 8) +
                                           (long)((iVar3 * iVar13 + iVar24) * paVar1[iVar12].w2 * 8)
                                           ,paVar1[iVar12].w2,local_f8,z->dequant[paVar1[iVar12].tq]
                                          );
                                iVar9 = iVar9 + 1;
                                iVar8 = paVar1[iVar12].h;
                              } while (iVar9 < iVar8);
                              iVar9 = paVar1[iVar12].v;
                            }
                            iVar24 = iVar24 + 1;
                          } while (iVar24 < iVar9);
                          iVar8 = z->scan_n;
                        }
                        lVar26 = lVar26 + 1;
                      } while (lVar26 < iVar8);
                      iVar12 = z->todo;
                    }
                    iVar8 = iVar12 + -1;
                    z->todo = iVar8;
                    if (iVar12 < 2) {
                      if (z->code_bits < 0x18) {
                        grow_buffer_unsafe(z);
                      }
                      if ((z->marker & 0xf8) != 0xd0) {
                        local_180 = 1;
                        goto LAB_00155330;
                      }
                      z->code_buffer = 0;
                      z->code_bits = 0;
                      z->nomore = 0;
                      z->img_comp[2].dc_pred = 0;
                      z->img_comp[1].dc_pred = 0;
                      z->img_comp[0].dc_pred = 0;
                      z->marker = 0xff;
                      iVar8 = z->restart_interval;
                      if (iVar8 == 0) {
                        iVar8 = 0x7fffffff;
                      }
                      z->todo = iVar8;
                    }
                    iVar20 = iVar20 + 1;
                    iVar9 = z->img_mcu_x;
                    iVar12 = iVar8;
                  } while (iVar20 < iVar9);
                  iVar12 = z->img_mcu_y;
                }
                iVar13 = iVar13 + 1;
              } while (iVar13 < iVar12);
            }
          }
          goto LAB_00155338;
        }
      }
    }
LAB_00155832:
    failure_reason = "Corrupt JPEG";
  }
LAB_00155840:
  cleanup_jpeg(z);
  return (uint8 *)0x0;
LAB_001558b7:
  do {
    pvVar14 = malloc((ulong)(uVar10 + 3));
    *(void **)((long)&z->img_comp[0].linebuf + lVar26) = pvVar14;
    if (pvVar14 == (void *)0x0) goto LAB_00155cbd;
    uVar21 = (long)z->img_h_max / (long)*(int *)((long)&z->img_comp[0].h + lVar26);
    iVar8 = (int)uVar21;
    piVar25[-4] = iVar8;
    iVar12 = z->img_v_max / *(int *)((long)&z->img_comp[0].v + lVar26);
    piVar25[-3] = iVar12;
    piVar25[-1] = iVar12 >> 1;
    piVar25[-2] = (int)((ulong)((uVar10 - 1) + iVar8) / (uVar21 & 0xffffffff));
    *piVar25 = 0;
    uVar6 = *(undefined8 *)((long)&z->img_comp[0].data + lVar26);
    *(undefined8 *)(piVar25 + -6) = uVar6;
    *(undefined8 *)(piVar25 + -8) = uVar6;
    if (iVar8 == 2) {
      pcVar15 = resample_row_generic;
      if (iVar12 == 2) {
        pcVar15 = resample_row_hv_2;
      }
      pcVar18 = resample_row_h_2;
LAB_00155979:
      if (iVar12 == 1) {
        pcVar15 = pcVar18;
      }
    }
    else {
      pcVar15 = resample_row_generic;
      if (iVar8 == 1) {
        pcVar15 = resample_row_generic;
        if (iVar12 == 2) {
          pcVar15 = resample_row_v_2;
        }
        pcVar18 = resample_row_1;
        goto LAB_00155979;
      }
    }
    *(code **)(piVar25 + -10) = pcVar15;
    lVar26 = lVar26 + 0x48;
    piVar25 = piVar25 + 0xc;
  } while ((ulong)uVar17 * 0x48 != lVar26);
LAB_00155992:
  uVar4 = (z->s).img_y;
  puVar16 = (uint8 *)malloc((ulong)(uVar10 * req_comp * uVar4 + 1));
  if (puVar16 == (uint8 *)0x0) {
LAB_00155cbd:
    cleanup_jpeg(z);
    failure_reason = "Out of memory";
    return (uint8 *)0x0;
  }
  if (uVar4 != 0) {
    iVar8 = 0;
    uVar19 = 0;
    do {
      if (0 < (int)uVar17) {
        piVar25 = local_d0;
        uVar21 = 0;
        piVar27 = &z->img_comp[0].y;
        do {
          iVar12 = piVar25[-1];
          iVar9 = piVar25[-3];
          iVar13 = iVar9 >> 1;
          pvVar14 = (void *)(**(code **)(piVar25 + -10))
                                      (*(uint8 **)(piVar27 + 8),
                                       *(undefined8 *)
                                        ((long)piVar25 +
                                        ((ulong)(iVar13 <= iVar12) << 3 | 0xffffffffffffffe0)),
                                       *(undefined8 *)
                                        ((long)piVar25 +
                                        ((ulong)(iVar12 < iVar13) << 3 | 0xffffffffffffffe0)),
                                       piVar25[-2],piVar25[-4]);
          (&local_118)[uVar21] = pvVar14;
          piVar25[-1] = iVar12 + 1;
          if (iVar9 <= iVar12 + 1) {
            piVar25[-1] = 0;
            *(long *)(piVar25 + -8) = *(long *)(piVar25 + -6);
            iVar12 = *piVar25;
            *piVar25 = iVar12 + 1;
            if (iVar12 + 1 < *piVar27) {
              *(long *)(piVar25 + -6) = *(long *)(piVar25 + -6) + (long)piVar27[1];
            }
          }
          uVar21 = uVar21 + 1;
          piVar27 = piVar27 + 0x12;
          piVar25 = piVar25 + 0xc;
        } while (uVar17 != uVar21);
      }
      if (req_comp < 3) {
        uVar5 = (z->s).img_x;
        if (req_comp == 1) {
          if (uVar5 == 0) {
LAB_00155c5d:
            uVar5 = 0;
          }
          else {
            memcpy(puVar16 + uVar19 * uVar10,local_118,(ulong)uVar5);
          }
        }
        else {
          if (uVar5 == 0) goto LAB_00155c5d;
          uVar21 = 0;
          do {
            puVar16[uVar21 * 2 + (ulong)(uVar10 * iVar8)] = *(uint8 *)((long)local_118 + uVar21);
            puVar16[uVar21 * 2 + (ulong)(uVar10 * iVar8) + 1] = 0xff;
            uVar21 = uVar21 + 1;
          } while (uVar5 != uVar21);
        }
      }
      else if ((z->s).img_n == 3) {
        uVar5 = (z->s).img_x;
        if (0 < (long)(int)uVar5) {
          puVar23 = puVar16 + (ulong)(uVar10 * iVar8) + 3;
          lVar26 = 0;
          do {
            iVar9 = (uint)*(byte *)((long)local_118 + lVar26) * 0x10000;
            iVar13 = *(byte *)(local_108 + lVar26) - 0x80;
            iVar12 = iVar13 * 0x166e9 + iVar9 + 0x8000 >> 0x10;
            if (iVar12 < 1) {
              iVar12 = 0;
            }
            if (0xfe < iVar12) {
              iVar12 = 0xff;
            }
            iVar20 = *(byte *)(local_110 + lVar26) - 0x80;
            iVar13 = iVar20 * -0x581a + iVar13 * -0xb6d2 + iVar9 + 0x8000;
            if (iVar13 >> 0x10 < 1) {
              iVar13 = 0;
            }
            iVar13 = iVar13 >> 0x10;
            if (0xfe < iVar13) {
              iVar13 = 0xff;
            }
            iVar20 = iVar9 + iVar20 * 0x1c5a2 + 0x8000 >> 0x10;
            iVar9 = 0;
            if (0 < iVar20) {
              iVar9 = iVar20;
            }
            if (0xfe < iVar9) {
              iVar9 = 0xff;
            }
            puVar23[-3] = (uint8)iVar12;
            puVar23[-2] = (uint8)iVar13;
            puVar23[-1] = (uint8)iVar9;
            *puVar23 = 0xff;
            lVar26 = lVar26 + 1;
            puVar23 = puVar23 + (uint)req_comp;
          } while ((int)uVar5 != lVar26);
        }
      }
      else {
        uVar5 = (z->s).img_x;
        if ((ulong)uVar5 == 0) goto LAB_00155c5d;
        puVar23 = puVar16 + (ulong)(uVar10 * iVar8) + 3;
        uVar21 = 0;
        do {
          uVar2 = *(uint8 *)((long)local_118 + uVar21);
          puVar23[-1] = uVar2;
          puVar23[-2] = uVar2;
          puVar23[-3] = uVar2;
          *puVar23 = 0xff;
          uVar21 = uVar21 + 1;
          puVar23 = puVar23 + (uint)req_comp;
        } while (uVar5 != uVar21);
      }
      uVar10 = uVar5;
      uVar19 = uVar19 + 1;
      iVar8 = iVar8 + req_comp;
    } while (uVar19 < (z->s).img_y);
  }
  cleanup_jpeg(z);
  *out_x = (z->s).img_x;
  *out_y = (z->s).img_y;
  if (comp != (int *)0x0) {
    *comp = (z->s).img_n;
    return puVar16;
  }
  return puVar16;
}

Assistant:

static uint8 *load_jpeg_image(jpeg *z, int *out_x, int *out_y, int *comp, int req_comp)
{
   int n, decode_n;
   // validate req_comp
   if (req_comp < 0 || req_comp > 4) return epuc("bad req_comp", "Internal error");
   z->s.img_n = 0;

   // load a jpeg image from whichever source
   if (!decode_jpeg_image(z)) { cleanup_jpeg(z); return NULL; }

   // determine actual number of components to generate
   n = req_comp ? req_comp : z->s.img_n;

   if (z->s.img_n == 3 && n < 3)
      decode_n = 1;
   else
      decode_n = z->s.img_n;

   // resample and color-convert
   {
      int k;
      uint i,j;
      uint8 *output;
      uint8 *coutput[4];

      stbi_resample res_comp[4];

      for (k=0; k < decode_n; ++k) {
         stbi_resample *r = &res_comp[k];

         // allocate line buffer big enough for upsampling off the edges
         // with upsample factor of 4
         z->img_comp[k].linebuf = (uint8 *) malloc(z->s.img_x + 3);
         if (!z->img_comp[k].linebuf) { cleanup_jpeg(z); return epuc("outofmem", "Out of memory"); }

         r->hs      = z->img_h_max / z->img_comp[k].h;
         r->vs      = z->img_v_max / z->img_comp[k].v;
         r->ystep   = r->vs >> 1;
         r->w_lores = (z->s.img_x + r->hs-1) / r->hs;
         r->ypos    = 0;
         r->line0   = r->line1 = z->img_comp[k].data;

         if      (r->hs == 1 && r->vs == 1) r->resample = resample_row_1;
         else if (r->hs == 1 && r->vs == 2) r->resample = resample_row_v_2;
         else if (r->hs == 2 && r->vs == 1) r->resample = resample_row_h_2;
         else if (r->hs == 2 && r->vs == 2) r->resample = resample_row_hv_2;
         else                               r->resample = resample_row_generic;
      }

      // can't error after this so, this is safe
      output = (uint8 *) malloc(n * z->s.img_x * z->s.img_y + 1);
      if (!output) { cleanup_jpeg(z); return epuc("outofmem", "Out of memory"); }

      // now go ahead and resample
      for (j=0; j < z->s.img_y; ++j) {
         uint8 *out = output + n * z->s.img_x * j;
         for (k=0; k < decode_n; ++k) {
            stbi_resample *r = &res_comp[k];
            int y_bot = r->ystep >= (r->vs >> 1);
            coutput[k] = r->resample(z->img_comp[k].linebuf,
                                     y_bot ? r->line1 : r->line0,
                                     y_bot ? r->line0 : r->line1,
                                     r->w_lores, r->hs);
            if (++r->ystep >= r->vs) {
               r->ystep = 0;
               r->line0 = r->line1;
               if (++r->ypos < z->img_comp[k].y)
                  r->line1 += z->img_comp[k].w2;
            }
         }
         if (n >= 3) {
            uint8 *y = coutput[0];
            if (z->s.img_n == 3) {
               #if STBI_SIMD
               stbi_YCbCr_installed(out, y, coutput[1], coutput[2], z->s.img_x, n);
               #else
               YCbCr_to_RGB_row(out, y, coutput[1], coutput[2], z->s.img_x, n);
               #endif
            } else
               for (i=0; i < z->s.img_x; ++i) {
                  out[0] = out[1] = out[2] = y[i];
                  out[3] = 255; // not used if n==3
                  out += n;
               }
         } else {
            uint8 *y = coutput[0];
            if (n == 1)
               for (i=0; i < z->s.img_x; ++i) out[i] = y[i];
            else
               for (i=0; i < z->s.img_x; ++i) *out++ = y[i], *out++ = 255;
         }
      }
      cleanup_jpeg(z);
      *out_x = z->s.img_x;
      *out_y = z->s.img_y;
      if (comp) *comp  = z->s.img_n; // report original components, not output
      return output;
   }
}